

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode ws_flush(Curl_easy *data,websocket *ws,_Bool blocking)

{
  websocket *data_00;
  _Bool _Var1;
  size_t sVar2;
  size_t local_48;
  size_t local_40;
  size_t n;
  size_t outlen;
  uchar *out;
  CURLcode result;
  _Bool blocking_local;
  websocket *ws_local;
  Curl_easy *data_local;
  
  out._7_1_ = blocking;
  _result = ws;
  ws_local = (websocket *)data;
  _Var1 = Curl_bufq_is_empty(&ws->sendbuf);
  if (!_Var1) {
    while (_Var1 = Curl_bufq_peek(&_result->sendbuf,(uchar **)&outlen,&n), _Var1) {
      if ((out._7_1_ & 1) == 0) {
        if ((*(char *)((long)&ws_local[10].frame.bytesleft + 1) != '\0') ||
           (_Var1 = Curl_is_in_callback((Curl_easy *)ws_local), _Var1)) {
          out._0_4_ = Curl_senddata((Curl_easy *)ws_local,(void *)outlen,n,&local_40);
        }
        else {
          out._0_4_ = Curl_xfer_send((Curl_easy *)ws_local,(void *)outlen,n,false,&local_40);
          if ((((CURLcode)out == CURLE_OK) && (local_40 == 0)) && (n != 0)) {
            out._0_4_ = CURLE_AGAIN;
          }
        }
      }
      else {
        out._0_4_ = ws_send_raw_blocking((CURL *)ws_local,_result,(char *)outlen,n);
        if ((CURLcode)out == CURLE_OK) {
          local_48 = n;
        }
        else {
          local_48 = 0;
        }
        local_40 = local_48;
      }
      data_00 = ws_local;
      if ((CURLcode)out == CURLE_AGAIN) {
        if ((((ws_local != (websocket *)0x0) &&
             ((*(ulong *)((long)&ws_local[10].frame.bytesleft + 2) >> 0x1c & 1) != 0)) &&
            ((ws_local[0x13].sendbuf.max_chunks == 0 ||
             (0 < *(int *)(ws_local[0x13].sendbuf.max_chunks + 8))))) &&
           (0 < Curl_trc_feat_ws.log_level)) {
          sVar2 = Curl_bufq_len(&_result->sendbuf);
          Curl_trc_ws((Curl_easy *)data_00,"flush EAGAIN, %zu bytes remain in buffer",sVar2);
        }
        return (CURLcode)out;
      }
      if ((CURLcode)out != CURLE_OK) {
        Curl_failf((Curl_easy *)ws_local,"WS: flush, write error %d",(ulong)(CURLcode)out);
        return (CURLcode)out;
      }
      if (((ws_local != (websocket *)0x0) &&
          ((*(ulong *)((long)&ws_local[10].frame.bytesleft + 2) >> 0x1c & 1) != 0)) &&
         ((ws_local[0x13].sendbuf.max_chunks == 0 ||
          (0 < *(int *)(ws_local[0x13].sendbuf.max_chunks + 8))))) {
        Curl_infof((Curl_easy *)ws_local,"WS: flushed %zu bytes",local_40);
      }
      Curl_bufq_skip(&_result->sendbuf,local_40);
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ws_flush(struct Curl_easy *data, struct websocket *ws,
                         bool blocking)
{
  if(!Curl_bufq_is_empty(&ws->sendbuf)) {
    CURLcode result;
    const unsigned char *out;
    size_t outlen, n;

    while(Curl_bufq_peek(&ws->sendbuf, &out, &outlen)) {
      if(blocking) {
        result = ws_send_raw_blocking(data, ws, (char *)out, outlen);
        n = result ? 0 : outlen;
      }
      else if(data->set.connect_only || Curl_is_in_callback(data))
        result = Curl_senddata(data, out, outlen, &n);
      else {
        result = Curl_xfer_send(data, out, outlen, FALSE, &n);
        if(!result && !n && outlen)
          result = CURLE_AGAIN;
      }

      if(result == CURLE_AGAIN) {
        CURL_TRC_WS(data, "flush EAGAIN, %zu bytes remain in buffer",
                    Curl_bufq_len(&ws->sendbuf));
        return result;
      }
      else if(result) {
        failf(data, "WS: flush, write error %d", result);
        return result;
      }
      else {
        infof(data, "WS: flushed %zu bytes", n);
        Curl_bufq_skip(&ws->sendbuf, n);
      }
    }
  }
  return CURLE_OK;
}